

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

void PrintOutput(N_Vector cc)

{
  long lVar1;
  long *in_RDI;
  sunrealtype *ct;
  int jy;
  int jx;
  int is;
  int local_c;
  
  lVar1 = *(long *)(*in_RDI + 0x10);
  printf("\nAt bottom left:");
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    if ((local_c % 6) * 6 == local_c) {
      printf("\n");
    }
    printf(" %g",*(undefined8 *)(lVar1 + (long)local_c * 8));
  }
  lVar1 = *(long *)(*in_RDI + 0x10);
  printf("\n\nAt top right:");
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    if ((local_c % 6) * 6 == local_c) {
      printf("\n");
    }
    printf(" %g",*(undefined8 *)(lVar1 + 0x480 + (long)local_c * 8));
  }
  printf("\n\n");
  return;
}

Assistant:

static void PrintOutput(N_Vector cc)
{
  int is, jx, jy;
  sunrealtype* ct;

  jy = 0;
  jx = 0;
  ct = IJ_Vptr(cc, jx, jy);
  printf("\nAt bottom left:");

  /* Print out lines with up to 6 values per line */
  for (is = 0; is < NUM_SPECIES; is++)
  {
    if ((is % 6) * 6 == is) { printf("\n"); }
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf(" %Lg", ct[is]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf(" %g", ct[is]);
#else
    printf(" %g", ct[is]);
#endif
  }

  jy = MY - 1;
  jx = MX - 1;
  ct = IJ_Vptr(cc, jx, jy);
  printf("\n\nAt top right:");

  /* Print out lines with up to 6 values per line */
  for (is = 0; is < NUM_SPECIES; is++)
  {
    if ((is % 6) * 6 == is) { printf("\n"); }
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf(" %Lg", ct[is]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf(" %g", ct[is]);
#else
    printf(" %g", ct[is]);
#endif
  }
  printf("\n\n");
}